

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::alloca_destructor<libtorrent::aux::bandwidth_channel_*>::~alloca_destructor
          (alloca_destructor<libtorrent::aux::bandwidth_channel_*> *this)

{
  bandwidth_channel **ppbVar1;
  
  if ((0x200 < (this->objects).m_len) &&
     (ppbVar1 = (this->objects).m_ptr, ppbVar1 != (bandwidth_channel **)0x0)) {
    operator_delete__(ppbVar1);
    return;
  }
  return;
}

Assistant:

~alloca_destructor()
	{
		if (objects.size() > cutoff)
		{
			delete [] objects.data();
		}
		else
		{
			for (auto& o : objects)
			{
				TORRENT_UNUSED(o);
				o.~T();
			}
		}
	}